

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglshaderprogram.h
# Opt level: O2

void __thiscall
rengine::OpenGLShaderProgram::initialize
          (OpenGLShaderProgram *this,char *vsh,char *fsh,
          vector<const_char_*,_std::allocator<const_char_*>_> *attrs)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  uint uVar4;
  int iVar5;
  const_reference ppcVar6;
  ostream *poVar7;
  char *pcVar8;
  string local_68 [36];
  int local_44;
  char *pcStack_40;
  int l;
  int local_34 [2];
  int param;
  
  if (this->m_id == 0) {
    GVar1 = createShader(this,vsh,0x8b31);
    pcStack_40 = fsh;
    GVar2 = createShader(this,fsh,0x8b30);
    if (GVar1 == 0) {
      pcVar8 = "vid";
      uVar4 = 0x41;
    }
    else if (GVar2 == 0) {
      pcVar8 = "fid";
      uVar4 = 0x42;
    }
    else {
      GVar3 = glCreateProgram();
      this->m_id = GVar3;
      glAttachShader(GVar3,GVar1);
      glAttachShader(this->m_id,GVar2);
      uVar4 = 0;
      while( true ) {
        GVar1 = this->m_id;
        if ((ulong)((long)(attrs->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(attrs->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar4) break;
        ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(attrs,(ulong)uVar4);
        glBindAttribLocation(GVar1,uVar4,*ppcVar6);
        uVar4 = uVar4 + 1;
      }
      glLinkProgram(GVar1);
      local_34[0] = 0;
      glGetProgramiv(this->m_id,0x8b82,local_34);
      if (local_34[0] == 0) {
        glGetProgramiv(this->m_id,0x8b84,local_34);
        iVar5 = local_34[0];
        pcVar8 = (char *)malloc((long)local_34[0] + 1);
        local_44 = 0;
        glGetProgramInfoLog(this->m_id,iVar5,&local_44,pcVar8);
        if (local_44 < local_34[0]) {
          pcVar8[local_44] = '\0';
          poVar7 = std::operator<<((ostream *)&std::cerr,"E [");
          log_timestring_abi_cxx11_();
          poVar7 = std::operator<<(poVar7,local_68);
          poVar7 = std::operator<<(poVar7,"]: ");
          poVar7 = std::operator<<(poVar7,
                                   "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                                  );
          poVar7 = std::operator<<(poVar7,": ");
          poVar7 = std::operator<<(poVar7,"Failed to link shader program:");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"Vertex Shader:");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,vsh);
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"FragmentShader:");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,pcStack_40);
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"error: ");
          poVar7 = std::operator<<(poVar7,pcVar8);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::string::~string(local_68);
          free(pcVar8);
          pcVar8 = "false";
          uVar4 = 0x5b;
        }
        else {
          pcVar8 = "l < param";
          uVar4 = 0x54;
        }
      }
      else {
        iVar5 = glGetError();
        if (iVar5 == 0) {
          this->m_attributeCount =
               (int)((ulong)((long)(attrs->
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(attrs->
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
          return;
        }
        pcVar8 = "glGetError() == GL_NO_ERROR";
        uVar4 = 0x5e;
      }
    }
  }
  else {
    pcVar8 = "m_id == 0";
    uVar4 = 0x3d;
  }
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                ,uVar4,
                "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
               );
}

Assistant:

void initialize(const char *vsh, const char *fsh, const std::vector<const char *> &attrs)
    {
        assert(m_id == 0);

        GLuint vid = createShader(vsh, GL_VERTEX_SHADER);
        GLuint fid = createShader(fsh, GL_FRAGMENT_SHADER);
        assert(vid);
        assert(fid);

        m_id = glCreateProgram();
        glAttachShader(m_id, vid);
        glAttachShader(m_id, fid);

        for (unsigned i=0; i<attrs.size(); ++i)
            glBindAttribLocation(m_id, i, attrs.at(i));

        glLinkProgram(m_id);

        int param = 0;
        glGetProgramiv(m_id, GL_LINK_STATUS, &param);
        if (param == GL_FALSE) {
            glGetProgramiv(m_id, GL_INFO_LOG_LENGTH, &param);
            char *str = (char *) malloc(param + 1);
            int l = 0;
            glGetProgramInfoLog(m_id, param, &l, str);
            assert(l < param);
            str[l] = '\0';
            loge << "Failed to link shader program:" << std::endl
                 << "Vertex Shader:" << std::endl << vsh << std::endl
                 << "FragmentShader:" << std::endl << fsh << std::endl
                 << "error: " << str << std::endl;
            free(str);
            assert(false);
        }

        assert(glGetError() == GL_NO_ERROR);

        m_attributeCount = attrs.size();
    }